

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_general_insertion<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>
               (void)

{
  pointer ppVar1;
  ulong uVar2;
  Column *pCVar3;
  pointer pvVar4;
  Column_zp_settings *this;
  Column_support *pCVar5;
  logic_error *this_00;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  node_ptr plVar9;
  ulong uVar10;
  bool bVar11;
  Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_> m;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  value_type col1;
  value_type col2;
  undefined **local_728;
  ulong local_720;
  shared_count sStack_718;
  undefined4 **local_710;
  undefined **local_708;
  char *local_700;
  undefined8 *local_6f8;
  char *local_6f0;
  Index local_6e4;
  undefined **local_6e0;
  undefined1 local_6d8;
  undefined8 *local_6d0;
  undefined ***local_6c8;
  undefined4 local_6bc;
  undefined1 local_6b8 [72];
  ulong *local_670;
  pointer local_650;
  Index local_638;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_620;
  undefined4 *local_608;
  Index *local_600;
  undefined1 local_5f8 [8];
  undefined8 local_5f0;
  shared_count sStack_5e8;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_5e0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_5c8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>>
            ();
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_5c8,
           local_620.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1);
  ppVar1 = local_620.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = local_620.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (ppVar1 != (pointer)0x0) {
    pvVar4 = local_620.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_620.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_620.
         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(ppVar1,(long)(pvVar4->
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar1)
    ;
    pvVar4 = local_620.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_620.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_5e0,
           local_620.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1);
  ppVar1 = local_620.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = local_620.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (ppVar1 != (pointer)0x0) {
    pvVar4 = local_620.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_620.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_620.
         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(ppVar1,(long)(pvVar4->
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar1)
    ;
    pvVar4 = local_620.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_620.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>::
  Column_zp_settings::Column_zp_settings(this,5);
  local_6b8._0_8_ = this;
  Gudhi::persistence_matrix::
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>
  ::
  Base_matrix_with_column_compression<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>
              *)(local_6b8 + 8),&local_620,this);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x18e);
  uVar2 = local_670[1];
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 1) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 1;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  if (local_650[uVar7 & 0xffffffff] == (Column *)0x0) {
    bVar11 = true;
  }
  else {
    pCVar5 = &(local_650[uVar7 & 0xffffffff]->super_Column).column_;
    plVar9 = (node_ptr)pCVar5;
    do {
      plVar9 = (((type *)&plVar9->next_)->data_).root_plus_size_.m_header.super_node.next_;
      bVar11 = plVar9 == (node_ptr)pCVar5;
      if (bVar11) goto LAB_0011f4ab;
    } while (*(int *)&plVar9[1].next_ != 0);
    bVar11 = false;
  }
LAB_0011f4ab:
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x1554cc;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_6c8 = &local_708;
  local_728._0_1_ = bVar11;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,399);
  uVar2 = local_670[3];
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 3) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 3;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  if (local_650[uVar7 & 0xffffffff] == (Column *)0x0) {
    local_728._0_1_ = 0;
  }
  else {
    pCVar5 = &(local_650[uVar7 & 0xffffffff]->super_Column).column_;
    plVar9 = (node_ptr)pCVar5;
    do {
      plVar9 = (((type *)&plVar9->next_)->data_).root_plus_size_.m_header.super_node.next_;
      bVar11 = plVar9 == (node_ptr)pCVar5;
      if (bVar11) goto LAB_0011f5d3;
    } while (*(int *)&plVar9[1].next_ != 0);
    bVar11 = false;
LAB_0011f5d3:
    local_728._0_1_ = bVar11 ^ 1;
  }
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x1554e2;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_6c8 = &local_708;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,400);
  uVar2 = *local_670;
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 0) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 0;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  pCVar3 = local_650[uVar7 & 0xffffffff];
  if (pCVar3 == (Column *)0x0) {
    local_728._0_1_ = true;
  }
  else {
    plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node.
             next_;
    local_728._0_1_ = plVar9 == (node_ptr)&(pCVar3->super_Column).column_ || plVar9 == (node_ptr)0x0
    ;
  }
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x1554f9;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_6c8 = &local_708;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x191);
  uVar2 = local_670[1];
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 1) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 1;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  pCVar3 = local_650[uVar7 & 0xffffffff];
  if (pCVar3 == (Column *)0x0) {
    local_728._0_1_ = true;
  }
  else {
    plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node.
             next_;
    local_728._0_1_ = plVar9 == (node_ptr)&(pCVar3->super_Column).column_ || plVar9 == (node_ptr)0x0
    ;
  }
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x15550d;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_6c8 = &local_708;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x192);
  uVar2 = local_670[2];
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 2) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 2;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  pCVar3 = local_650[uVar7 & 0xffffffff];
  if (pCVar3 == (Column *)0x0) {
    local_728._0_1_ = true;
  }
  else {
    plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node.
             next_;
    local_728._0_1_ = plVar9 == (node_ptr)&(pCVar3->super_Column).column_ || plVar9 == (node_ptr)0x0
    ;
  }
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x155521;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_6c8 = &local_708;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x193);
  uVar2 = local_670[3];
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 3) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 3;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  pCVar3 = local_650[uVar7 & 0xffffffff];
  if (pCVar3 == (Column *)0x0) {
    local_728._0_1_ = false;
  }
  else {
    plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node.
             next_;
    local_728._0_1_ = plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0
    ;
  }
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x155535;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_6c8 = &local_708;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x194);
  uVar2 = local_670[4];
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 4) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 4;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  pCVar3 = local_650[uVar7 & 0xffffffff];
  if (pCVar3 == (Column *)0x0) {
    local_728._0_1_ = true;
  }
  else {
    plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node.
             next_;
    local_728._0_1_ = plVar9 == (node_ptr)&(pCVar3->super_Column).column_ || plVar9 == (node_ptr)0x0
    ;
  }
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x15554a;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_6c8 = &local_708;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x195);
  uVar2 = local_670[5];
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 5) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 5;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  pCVar3 = local_650[uVar7 & 0xffffffff];
  if (pCVar3 == (Column *)0x0) {
    local_728._0_1_ = false;
  }
  else {
    plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node.
             next_;
    local_728._0_1_ = plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0
    ;
  }
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x15555e;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_6c8 = &local_708;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x196);
  uVar2 = local_670[6];
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 6) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 6;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  pCVar3 = local_650[uVar7 & 0xffffffff];
  if (pCVar3 == (Column *)0x0) {
    local_728._0_1_ = false;
  }
  else {
    plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node.
             next_;
    local_728._0_1_ = plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0
    ;
  }
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x155573;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_6c8 = &local_708;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x197);
  uVar2 = local_670[7];
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 7) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 7;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  pCVar3 = local_650[uVar7 & 0xffffffff];
  if (pCVar3 == (Column *)0x0) {
    local_728._0_1_ = false;
  }
  else {
    plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node.
             next_;
    local_728._0_1_ = plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0
    ;
  }
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x155588;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_6c8 = &local_708;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x198);
  uVar2 = local_670[8];
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 8) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 8;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  pCVar3 = local_650[uVar7 & 0xffffffff];
  if (pCVar3 == (Column *)0x0) {
    local_728._0_1_ = false;
  }
  else {
    plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node.
             next_;
    local_728._0_1_ = plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0
    ;
  }
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x15559d;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_6c8 = &local_708;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x199);
  uVar2 = local_670[9];
  uVar7 = uVar2;
  uVar10 = uVar2;
  if (uVar2 != 9) {
    do {
      uVar7 = local_670[uVar10];
      bVar11 = uVar7 != uVar10;
      uVar10 = uVar7;
    } while (bVar11);
  }
  if (uVar7 != uVar2) {
    uVar10 = 9;
    do {
      uVar8 = uVar2;
      local_670[uVar10] = uVar7;
      uVar2 = local_670[uVar8];
      uVar10 = uVar8;
    } while (uVar7 != local_670[uVar8]);
  }
  pCVar3 = local_650[uVar7 & 0xffffffff];
  if (pCVar3 == (Column *)0x0) {
    bVar11 = false;
  }
  else {
    plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node.
             next_;
    bVar11 = plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0;
  }
  local_728 = (undefined **)CONCAT71(local_728._1_7_,bVar11);
  local_720 = 0;
  sStack_718.pi_ = (sp_counted_base *)0x0;
  local_708 = (undefined **)0x1555b2;
  local_700 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b950;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_6c8 = &local_708;
  boost::test_tools::tt_detail::report_assertion(&local_728,&local_6e0,&local_270,0x199,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_718);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x19a);
  local_700 = (char *)((ulong)local_700 & 0xffffffffffffff00);
  local_708 = &PTR__lazy_ostream_0016b7f0;
  local_6f8 = &boost::unit_test::lazy_ostream::inst;
  local_6f0 = "";
  local_600 = &local_6e4;
  local_6e4 = local_638;
  local_5f8[0] = local_638 == 10;
  local_6bc = 10;
  local_5f0 = 0;
  sStack_5e8.pi_ = (sp_counted_base *)0x0;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5a8 = "";
  local_6d8 = 0;
  local_6e0 = &PTR__lazy_ostream_0016b738;
  local_6d0 = &boost::unit_test::lazy_ostream::inst;
  local_720 = local_720 & 0xffffffffffffff00;
  local_728 = &PTR__lazy_ostream_0016b7b0;
  sStack_718.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_710 = &local_608;
  local_6c8 = (undefined ***)&local_600;
  local_608 = &local_6bc;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5e8);
  if (((Field_operators *)local_6b8._0_8_)->characteristic_ == 0xffffffff) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "Matrix::insert_column - Columns cannot be initialized if the coefficient field characteristic is not specified."
              );
  }
  else {
    Gudhi::persistence_matrix::
    Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>
    ::
    insert_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
              ((Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>
                *)(local_6b8 + 8),&local_5e0);
    local_2a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
    ;
    local_298 = "";
    local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x19c);
    local_700 = (char *)((ulong)local_700 & 0xffffffffffffff00);
    local_708 = &PTR__lazy_ostream_0016b7f0;
    local_6f8 = &boost::unit_test::lazy_ostream::inst;
    local_6f0 = "";
    local_6e4 = local_638;
    local_5f8[0] = local_638 == 0xb;
    local_6bc = 0xb;
    local_5f0 = 0;
    sStack_5e8.pi_ = (sp_counted_base *)0x0;
    local_5b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
    ;
    local_5a8 = "";
    local_600 = &local_6e4;
    local_6d8 = 0;
    local_6e0 = &PTR__lazy_ostream_0016b738;
    local_6d0 = &boost::unit_test::lazy_ostream::inst;
    local_720 = local_720 & 0xffffffffffffff00;
    local_728 = &PTR__lazy_ostream_0016b7b0;
    sStack_718.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_710 = &local_608;
    local_6c8 = (undefined ***)&local_600;
    local_608 = &local_6bc;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_5e8);
    if (((Field_operators *)local_6b8._0_8_)->characteristic_ != 0xffffffff) {
      Gudhi::persistence_matrix::
      Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>
      ::
      insert_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                ((Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<false,(Gudhi::persistence_matrix::Column_types)7>>>
                  *)(local_6b8 + 8),&local_5c8);
      local_2c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_2b8 = "";
      local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c0,0x19e);
      local_700 = (char *)((ulong)local_700 & 0xffffffffffffff00);
      local_708 = &PTR__lazy_ostream_0016b7f0;
      local_6f8 = &boost::unit_test::lazy_ostream::inst;
      local_6f0 = "";
      local_6e4 = local_638;
      local_5f8[0] = local_638 == 0xc;
      local_6bc = 0xc;
      local_5f0 = 0;
      sStack_5e8.pi_ = (sp_counted_base *)0x0;
      local_5b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_5a8 = "";
      local_600 = &local_6e4;
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b738;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_720 = local_720 & 0xffffffffffffff00;
      local_728 = &PTR__lazy_ostream_0016b7b0;
      sStack_718.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_710 = &local_608;
      local_6c8 = (undefined ***)&local_600;
      local_608 = &local_6bc;
      boost::test_tools::tt_detail::report_assertion
                (local_5f8,&local_708,&local_5b0,0x19e,1,2,2,"m.get_number_of_columns()",&local_6e0,
                 "12",&local_728);
      boost::detail::shared_count::~shared_count(&sStack_5e8);
      local_2e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_2d8 = "";
      local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x19f);
      uVar2 = local_670[1];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 1) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 1;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      if (local_650[uVar7 & 0xffffffff] == (Column *)0x0) {
        bVar11 = true;
      }
      else {
        pCVar5 = &(local_650[uVar7 & 0xffffffff]->super_Column).column_;
        plVar9 = (node_ptr)pCVar5;
        do {
          plVar9 = (((type *)&plVar9->next_)->data_).root_plus_size_.m_header.super_node.next_;
          bVar11 = plVar9 == (node_ptr)pCVar5;
          if (bVar11) goto LAB_001206d6;
        } while (*(int *)&plVar9[1].next_ != 0);
        bVar11 = false;
      }
LAB_001206d6:
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x1554cc;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_300 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_2f8 = "";
      local_6c8 = &local_708;
      local_728._0_1_ = bVar11;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_310 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_308 = "";
      local_320 = &boost::unit_test::basic_cstring<char_const>::null;
      local_318 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x1a0);
      uVar2 = local_670[3];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 3) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 3;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      if (local_650[uVar7 & 0xffffffff] == (Column *)0x0) {
        local_728._0_1_ = 0;
      }
      else {
        pCVar5 = &(local_650[uVar7 & 0xffffffff]->super_Column).column_;
        plVar9 = (node_ptr)pCVar5;
        do {
          plVar9 = (((type *)&plVar9->next_)->data_).root_plus_size_.m_header.super_node.next_;
          bVar11 = plVar9 == (node_ptr)pCVar5;
          if (bVar11) goto LAB_00120803;
        } while (*(int *)&plVar9[1].next_ != 0);
        bVar11 = false;
LAB_00120803:
        local_728._0_1_ = bVar11 ^ 1;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x1554e2;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_330 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_328 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_340 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_338 = "";
      local_350 = &boost::unit_test::basic_cstring<char_const>::null;
      local_348 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x1a1);
      uVar2 = *local_670;
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 0) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 0;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = true;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 == (node_ptr)&(pCVar3->super_Column).column_ || plVar9 == (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x1554f9;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_360 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_358 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_370 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_368 = "";
      local_380 = &boost::unit_test::basic_cstring<char_const>::null;
      local_378 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x1a2);
      uVar2 = local_670[1];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 1) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 1;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = true;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 == (node_ptr)&(pCVar3->super_Column).column_ || plVar9 == (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x15550d;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_390 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_388 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_3a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_398 = "";
      local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x1a3);
      uVar2 = local_670[2];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 2) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 2;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = true;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 == (node_ptr)&(pCVar3->super_Column).column_ || plVar9 == (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x155521;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_3c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_3b8 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_3d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_3c8 = "";
      local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x1a4);
      uVar2 = local_670[3];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 3) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 3;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = false;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x155535;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_3f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_3e8 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_400 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_3f8 = "";
      local_410 = &boost::unit_test::basic_cstring<char_const>::null;
      local_408 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x1a5);
      uVar2 = local_670[4];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 4) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 4;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = true;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 == (node_ptr)&(pCVar3->super_Column).column_ || plVar9 == (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x15554a;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_420 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_418 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_430 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_428 = "";
      local_440 = &boost::unit_test::basic_cstring<char_const>::null;
      local_438 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0x1a6);
      uVar2 = local_670[5];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 5) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 5;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = false;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x15555e;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_450 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_448 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_460 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_458 = "";
      local_470 = &boost::unit_test::basic_cstring<char_const>::null;
      local_468 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x1a7);
      uVar2 = local_670[6];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 6) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 6;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = false;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x155573;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_480 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_478 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_490 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_488 = "";
      local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_498 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_490,0x1a8);
      uVar2 = local_670[7];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 7) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 7;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = false;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x155588;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_4b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_4a8 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_4c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_4b8 = "";
      local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4c0,0x1a9);
      uVar2 = local_670[8];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 8) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 8;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = false;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x15559d;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_4e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_4d8 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_4f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_4e8 = "";
      local_500 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4f0,0x1aa);
      uVar2 = local_670[9];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 9) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 9;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = false;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x1555b2;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_510 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_508 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_520 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_518 = "";
      local_530 = &boost::unit_test::basic_cstring<char_const>::null;
      local_528 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_520,0x1ab);
      uVar2 = local_670[10];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 10) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 10;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = false;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x1555d0;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_540 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_538 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_550 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_548 = "";
      local_560 = &boost::unit_test::basic_cstring<char_const>::null;
      local_558 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_550,0x1ac);
      uVar2 = local_670[0xb];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 0xb) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 0xb;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      pCVar3 = local_650[uVar7 & 0xffffffff];
      if (pCVar3 == (Column *)0x0) {
        local_728._0_1_ = false;
      }
      else {
        plVar9 = (pCVar3->super_Column).column_.super_type.data_.root_plus_size_.m_header.super_node
                 .next_;
        local_728._0_1_ =
             plVar9 != (node_ptr)&(pCVar3->super_Column).column_ && plVar9 != (node_ptr)0x0;
      }
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x1555e6;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_570 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_568 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      local_580 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_578 = "";
      local_590 = &boost::unit_test::basic_cstring<char_const>::null;
      local_588 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_580,0x1ad);
      uVar2 = local_670[3];
      uVar7 = uVar2;
      uVar10 = uVar2;
      if (uVar2 != 3) {
        do {
          uVar7 = local_670[uVar10];
          bVar11 = uVar7 != uVar10;
          uVar10 = uVar7;
        } while (bVar11);
      }
      if (uVar7 != uVar2) {
        uVar10 = 3;
        do {
          uVar8 = uVar2;
          local_670[uVar10] = uVar7;
          uVar2 = local_670[uVar8];
          uVar10 = uVar8;
        } while (uVar7 != local_670[uVar8]);
      }
      if (local_650[uVar7 & 0xffffffff] == (Column *)0x0) {
        bVar6 = 0;
      }
      else {
        pCVar5 = &(local_650[uVar7 & 0xffffffff]->super_Column).column_;
        plVar9 = (node_ptr)pCVar5;
        do {
          plVar9 = (((type *)&plVar9->next_)->data_).root_plus_size_.m_header.super_node.next_;
          bVar11 = plVar9 == (node_ptr)pCVar5;
          if (bVar11) goto LAB_001216f3;
        } while (*(int *)&plVar9[1].next_ != 1);
        bVar11 = false;
LAB_001216f3:
        bVar6 = bVar11 ^ 1;
      }
      local_728 = (undefined **)CONCAT71(local_728._1_7_,bVar6);
      local_720 = 0;
      sStack_718.pi_ = (sp_counted_base *)0x0;
      local_708 = (undefined **)0x1555fc;
      local_700 = "";
      local_6d8 = 0;
      local_6e0 = &PTR__lazy_ostream_0016b950;
      local_6d0 = &boost::unit_test::lazy_ostream::inst;
      local_5a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_598 = "";
      local_6c8 = &local_708;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_718);
      Gudhi::persistence_matrix::
      Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>::
      ~Matrix((Matrix<Column_compression_options<false,_(Gudhi::persistence_matrix::Column_types)7>_>
               *)local_6b8);
      if (local_5e0.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5e0.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_5e0.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_5e0.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_5c8.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5c8.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_5c8.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_5c8.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ::~vector(&local_620);
      return;
    }
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "Matrix::insert_column - Columns cannot be initialized if the coefficient field characteristic is not specified."
              );
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void test_general_insertion() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  auto col2 = columns.back();
  columns.pop_back();
  auto col1 = columns.back();
  columns.pop_back();

  Matrix m(columns, 5);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(m.is_zero_column(4));
  BOOST_CHECK(!m.is_zero_column(5));
  BOOST_CHECK(!m.is_zero_column(6));
  BOOST_CHECK(!m.is_zero_column(7));
  BOOST_CHECK(!m.is_zero_column(8));
  BOOST_CHECK(!m.is_zero_column(9));
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 10);
  m.insert_column(col1);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 11);
  m.insert_column(col2);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 12);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(m.is_zero_column(4));
  BOOST_CHECK(!m.is_zero_column(5));
  BOOST_CHECK(!m.is_zero_column(6));
  BOOST_CHECK(!m.is_zero_column(7));
  BOOST_CHECK(!m.is_zero_column(8));
  BOOST_CHECK(!m.is_zero_column(9));
  BOOST_CHECK(!m.is_zero_column(10));
  BOOST_CHECK(!m.is_zero_column(11));
  BOOST_CHECK(!m.is_zero_entry(3, 1));
}